

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall bsplib::exception::~exception(exception *this)

{
  exception *this_local;
  
  ~exception(this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

exception( const exception & e )
      : m_stream( e.m_stream.str() )
      , m_buf( )
    {}